

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O0

char IsDelimiter(int c)

{
  ushort **ppuVar1;
  bool local_d;
  int c_local;
  
  ppuVar1 = __ctype_b_loc();
  local_d = true;
  if ((((((*ppuVar1)[c] & 0x2000) == 0) && (local_d = true, c != -1)) && (local_d = true, c != 0x28)
      ) && ((local_d = true, c != 0x29 && (local_d = true, c != 0x22)))) {
    local_d = c == 0x3b;
  }
  return local_d;
}

Assistant:

static char
IsDelimiter(int c)
{
    return isspace(c) ||
           c == EOF ||
           c == '(' ||
           c == ')' ||
           c == '"' ||
           c == ';';
}